

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# W_final.cpp
# Opt level: O3

void __thiscall W_final::space_allocation(W_final *this)

{
  pointer pcVar1;
  long lVar2;
  minimum_fold *pmVar3;
  s_energy_matrix *this_00;
  pseudo_loop *this_01;
  minimum_fold *pmVar4;
  ulong uVar5;
  string local_a0;
  string local_80;
  string local_60;
  long *local_40 [2];
  long local_30 [2];
  
  lVar2 = (long)this->n;
  uVar5 = 0xffffffffffffffff;
  if (-2 < lVar2) {
    uVar5 = lVar2 * 4 + 4;
  }
  pmVar3 = (minimum_fold *)operator_new__(uVar5);
  if ((int)(lVar2 + 1) != 0) {
    pmVar4 = pmVar3;
    do {
      pmVar4->pair = -1;
      pmVar4->type = 'N';
      pmVar4 = pmVar4 + 1;
    } while (pmVar4 != pmVar3 + lVar2 + 1);
  }
  this->f = pmVar3;
  this_00 = (s_energy_matrix *)operator_new(0xb8);
  pcVar1 = (this->seq_)._M_dataplus._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + (this->seq_)._M_string_length);
  s_energy_matrix::s_energy_matrix(this_00,&local_60,this->n,this->S_,this->S1_,this->params_);
  this->V = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct((ulong)local_40,(char)this->n + '\x01');
  std::__cxx11::string::operator=((string *)&this->structure,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  this_01 = (pseudo_loop *)operator_new(0x188);
  pcVar1 = (this->seq_)._M_dataplus._M_p;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + (this->seq_)._M_string_length);
  pcVar1 = (this->res)._M_dataplus._M_p;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a0,pcVar1,pcVar1 + (this->res)._M_string_length);
  pseudo_loop::pseudo_loop(this_01,&local_80,&local_a0,this->V,this->S_,this->S1_,this->params_);
  this->WMB = this_01;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void W_final::space_allocation(){

	// From simfold
	f = new minimum_fold [n+1];

    V = new s_energy_matrix (seq_, n,S_,S1_,params_);
	structure = std::string (n+1,'.');

	// Hosna: June 20th 2007
    WMB = new pseudo_loop (seq_,res,V,S_,S1_,params_);

}